

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,float *__a,float *__b,float *__c)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = *__b;
  fVar7 = (float)(int)__a[2];
  fVar8 = *__a / fVar7;
  fVar2 = *__c;
  if (fVar8 <= fVar1 / fVar7) {
    if (fVar8 <= fVar2 / fVar7) {
      if (fVar2 / (float)(int)__b[2] < fVar1 / (float)(int)__b[2]) goto LAB_004f31af;
      goto LAB_004f31e6;
    }
  }
  else {
    if (fVar2 / (float)(int)__b[2] < fVar1 / (float)(int)__b[2]) {
LAB_004f31e6:
      uVar3 = __result[2];
      uVar4 = *__result;
      uVar5 = __result[1];
      __result[2] = *(undefined8 *)(__b + 4);
      uVar6 = *(undefined8 *)(__b + 2);
      *__result = *(undefined8 *)__b;
      __result[1] = uVar6;
      *(undefined8 *)(__b + 4) = uVar3;
      *(undefined8 *)__b = uVar4;
      *(undefined8 *)(__b + 2) = uVar5;
      return;
    }
    if (fVar2 / fVar7 < fVar8) {
LAB_004f31af:
      uVar3 = __result[2];
      uVar4 = *__result;
      uVar5 = __result[1];
      __result[2] = *(undefined8 *)(__c + 4);
      uVar6 = *(undefined8 *)(__c + 2);
      *__result = *(undefined8 *)__c;
      __result[1] = uVar6;
      *(undefined8 *)(__c + 4) = uVar3;
      *(undefined8 *)__c = uVar4;
      *(undefined8 *)(__c + 2) = uVar5;
      return;
    }
  }
  uVar3 = __result[2];
  uVar4 = *__result;
  uVar5 = __result[1];
  __result[2] = *(undefined8 *)(__a + 4);
  uVar6 = *(undefined8 *)(__a + 2);
  *__result = *(undefined8 *)__a;
  __result[1] = uVar6;
  *(undefined8 *)(__a + 4) = uVar3;
  *(undefined8 *)__a = uVar4;
  *(undefined8 *)(__a + 2) = uVar5;
  return;
}

Assistant:

constexpr bool operator<(const item& other) const noexcept
        {
            if constexpr (std::is_same_v<Mode, minimize_tag>)
                return (r / static_cast<Float>(factor)) <
                       (other.r / static_cast<Float>(factor));
            else
                return (other.r / static_cast<Float>(factor)) <
                       (r / static_cast<Float>(factor));
        }